

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O3

bool __thiscall
I2Cdev::writeBitsW(I2Cdev *this,uint16_t regAddr,uint8_t bitStart,uint8_t length,uint16_t data)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  undefined8 in_RAX;
  uint uVar4;
  undefined6 in_register_00000032;
  undefined2 in_register_00000082;
  undefined1 uVar5;
  undefined8 uStack_38;
  
  uVar5 = 0;
  uStack_38 = in_RAX;
  iVar3 = (*(this->super_I2Cgeneric)._vptr_I2Cgeneric[0x11])
                    (this,CONCAT62(in_register_00000032,regAddr),(long)&uStack_38 + 6,0);
  if ((char)iVar3 != '\0') {
    uVar4 = ~(-1 << (length & 0x1f));
    bVar1 = (bitStart - length) + 1;
    uVar2 = (ushort)(byte)((CONCAT22(in_register_00000082,data) & uVar4) << (bVar1 & 0x1f)) |
            (~(ushort)(uVar4 << (bVar1 & 0x1f)) | 0xff00) & uStack_38._6_2_;
    uStack_38 = CONCAT26(uVar2,(undefined6)uStack_38);
    iVar3 = (*(this->super_I2Cgeneric)._vptr_I2Cgeneric[0x21])(this,regAddr,(ulong)uVar2);
    uVar5 = (undefined1)iVar3;
  }
  return (bool)uVar5;
}

Assistant:

bool I2Cdev::writeBitsW(uint16_t regAddr, uint8_t bitStart, uint8_t length, uint16_t data) {
    //              010 value to write
    // fedcba9876543210 bit numbers
    //    xxx           args: bitStart=12, length=3
    // 0001110000000000 mask byte
    // 1010111110010110 original value (sample)
    // 1010001110010110 original & ~mask
    // 1010101110010110 masked | value
    uint16_t w;
    if (this->readWord(regAddr, &w) != 0) {
        uint8_t mask = ((1 << length) - 1) << (bitStart - length + 1);
        data <<= (bitStart - length + 1); // shift data into correct position
        data &= mask; // zero all non-important bits in data
        w &= ~(mask); // zero all important bits in existing word
        w |= data; // combine data with existing word
        return this->writeWord(regAddr, w);
    } else {
        return false;
    }
}